

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

bool __thiscall
axl::sl::Array<unsigned_char,_axl::sl::ArrayDetails<unsigned_char>_>::reserve
          (Array<unsigned_char,_axl::sl::ArrayDetails<unsigned_char>_> *this,size_t count)

{
  long lVar1;
  size_t sVar2;
  BufHdr *pBVar3;
  BufHdr *pBVar4;
  ulong in_RSI;
  BufHdr *in_RDI;
  uchar *p;
  Ptr<axl::rc::BufHdr> hdr;
  size_t bufferSize;
  size_t size;
  RefCount **in_stack_ffffffffffffffa8;
  BufHdr *in_stack_ffffffffffffffb0;
  Ptr local_38 [16];
  size_t local_28;
  ulong local_20;
  byte local_1;
  
  if ((in_RDI->super_RefCount).m_freeFunc != (FreeFunc *)0x0) {
    local_20 = in_RSI;
    sVar2 = rc::RefCount::getRefCount((RefCount *)(in_RDI->super_RefCount).m_freeFunc);
    if ((sVar2 == 1) && (local_20 <= *(ulong *)((in_RDI->super_RefCount).m_freeFunc + 0x18))) {
      local_1 = 1;
      goto LAB_001869fd;
    }
  }
  local_28 = getAllocSize(0x1868c9);
  pBVar3 = (BufHdr *)mem::allocate(0x1868dc);
  rc::BufHdr::BufHdr(in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8,(uintptr_t)in_RDI);
  rc::primeRefCount<axl::rc::BufHdr>(in_RDI,(FreeFunc *)pBVar3);
  rc::Ptr<axl::rc::BufHdr>::Ptr<axl::rc::BufHdr>((Ptr<axl::rc::BufHdr> *)in_RDI,pBVar3);
  pBVar4 = rc::Ptr::operator_cast_to_BufHdr_(local_38);
  if (pBVar4 == (BufHdr *)0x0) {
    local_1 = 0;
  }
  else {
    pBVar4 = rc::Ptr::operator_cast_to_BufHdr_(local_38);
    sVar2._0_4_ = (in_RDI->super_RefCount).m_refCount;
    sVar2._4_4_ = (in_RDI->super_RefCount).m_weakRefCount;
    SimpleArrayDetails<unsigned_char>::setHdrCount(pBVar4,sVar2);
    pBVar4 = rc::Ptr::operator_cast_to_BufHdr_(local_38);
    lVar1._0_4_ = (in_RDI->super_RefCount).m_refCount;
    lVar1._4_4_ = (in_RDI->super_RefCount).m_weakRefCount;
    if (lVar1 != 0) {
      SimpleArrayDetails<unsigned_char>::constructCopy((uchar *)in_RDI,(uchar *)pBVar3,0x186983);
    }
    if ((in_RDI->super_RefCount).m_freeFunc != (FreeFunc *)0x0) {
      rc::RefCount::release(&in_RDI->super_RefCount);
    }
    (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)(pBVar4 + 1);
    pBVar3 = rc::Ptr<axl::rc::BufHdr>::detach
                       ((Ptr<axl::rc::BufHdr> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8)
    ;
    (in_RDI->super_RefCount).m_freeFunc = (FreeFunc *)pBVar3;
    local_1 = 1;
  }
  rc::Ptr<axl::rc::BufHdr>::~Ptr((Ptr<axl::rc::BufHdr> *)0x1869fd);
LAB_001869fd:
  return (bool)(local_1 & 1);
}

Assistant:

bool
	reserve(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1 &&
			this->m_hdr->m_bufferSize >= size)
			return true;

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, this->m_count);

		T* p = (T*)(hdr + 1);

		if (this->m_count)
			Details::constructCopy(p, this->m_p, this->m_count);

		if (this->m_hdr)
			this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		return true;
	}